

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O1

void __thiscall OpenMD::DumpWriter::writeFrame(DumpWriter *this,ostream *os)

{
  DumpWriter *os_00;
  Molecule *pMVar1;
  char *pcVar2;
  size_t sVar3;
  StuntDouble *pSVar4;
  StuntDouble *sd;
  RigidBody *rb;
  int siteIndex;
  DumpWriter *this_00;
  int iVar5;
  pointer ppSVar6;
  _func_int **pp_Var7;
  int myturn;
  int nProc;
  int worldRank;
  int sendBufferLength;
  MoleculeIterator mi;
  string buffer;
  MPI_Status istatus;
  int local_bc;
  int local_b8;
  int local_b4;
  DumpWriter *local_b0;
  string local_a8;
  DumpWriter *local_88;
  MoleculeIterator local_80;
  char *local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  pointer local_58;
  Molecule *local_50;
  undefined1 local_48 [24];
  
  local_80._M_node = (_Base_ptr)0x0;
  local_b0 = (DumpWriter *)os;
  MPI_Comm_size(&ompi_mpi_comm_world,&local_b8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_b4);
  os_00 = local_b0;
  if (local_b4 == 0) {
    this_00 = local_b0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,"  <Snapshot>\n",0xd);
    writeFrameProperties(this_00,(ostream *)os_00,this->info_->sman_->currentSnapshot_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)os_00,"    <StuntDoubles>\n",0x13)
    ;
  }
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  local_88 = this;
  pMVar1 = SimInfo::beginMolecule(this->info_,&local_80);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar6 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar6 ==
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar4 = (StuntDouble *)0x0;
    }
    else {
      pSVar4 = *ppSVar6;
    }
    while (pSVar4 != (StuntDouble *)0x0) {
      ppSVar6 = ppSVar6 + 1;
      prepareDumpLine_abi_cxx11_(&local_a8,local_88,pSVar4);
      std::__cxx11::string::_M_append
                ((char *)&local_78,
                 CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
          &local_a8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                        local_a8.field_2._M_allocated_capacity + 1);
      }
      if (ppSVar6 ==
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar4 = (StuntDouble *)0x0;
      }
      else {
        pSVar4 = *ppSVar6;
      }
    }
    pMVar1 = SimInfo::nextMolecule(local_88->info_,&local_80);
  }
  if (local_b4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,local_78,local_70);
    local_a8._M_dataplus._M_p._0_4_ = 1;
    if (1 < local_b8) {
      do {
        MPI_Bcast(&local_a8,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
        MPI_Recv(&local_bc,1,&ompi_mpi_int,(int)local_a8._M_dataplus._M_p,0xffffffff,
                 &ompi_mpi_comm_world,local_48);
        iVar5 = local_bc;
        pcVar2 = (char *)operator_new__((long)local_bc);
        MPI_Recv(pcVar2,iVar5,&ompi_mpi_char,(int)local_a8._M_dataplus._M_p,0xffffffff,
                 &ompi_mpi_comm_world,local_48);
        sVar3 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,pcVar2,sVar3);
        operator_delete__(pcVar2);
        local_a8._M_dataplus._M_p._0_4_ = (int)local_a8._M_dataplus._M_p + 1;
      } while ((int)local_a8._M_dataplus._M_p < local_b8);
    }
  }
  else {
    local_a8._M_dataplus._M_p._0_4_ = (int)local_70 + 1;
    local_bc = 0;
    if (1 < local_b8) {
      iVar5 = 1;
      do {
        MPI_Bcast(&local_bc,1,&ompi_mpi_int,0);
        if (local_bc == local_b4) {
          MPI_Send(&local_a8,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
          MPI_Send(local_78,(int)local_a8._M_dataplus._M_p,&ompi_mpi_char,0,0,&ompi_mpi_comm_world);
        }
        iVar5 = iVar5 + 1;
      } while (iVar5 < local_b8);
    }
  }
  if (local_b4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_b0,"    </StuntDoubles>\n",0x14);
  }
  if (local_88->doSiteData_ == true) {
    if (local_b4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,"    <SiteData>\n",0xf)
      ;
    }
    local_70 = 0;
    *local_78 = '\0';
    pMVar1 = SimInfo::beginMolecule(local_88->info_,&local_80);
    while (pMVar1 != (Molecule *)0x0) {
      local_58 = (pMVar1->integrableObjects_).
                 super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_50 = pMVar1;
      while( true ) {
        if (local_58 ==
            (local_50->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar4 = (StuntDouble *)0x0;
        }
        else {
          pSVar4 = *local_58;
        }
        if (pSVar4 == (StuntDouble *)0x0) break;
        iVar5 = pSVar4->globalIntegrableObjectIndex_;
        prepareSiteLine_abi_cxx11_(&local_a8,local_88,pSVar4,iVar5,0);
        std::__cxx11::string::_M_append
                  ((char *)&local_78,
                   CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
            &local_a8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p),
                          local_a8.field_2._M_allocated_capacity + 1);
        }
        if (pSVar4->objType_ == otRigidBody) {
          pp_Var7 = (_func_int **)pSVar4[2].mass_;
          if (pp_Var7 == pSVar4[2].properties_._vptr_PropertyMap) {
            sd = (StuntDouble *)0x0;
          }
          else {
            sd = (StuntDouble *)*pp_Var7;
          }
          if (sd != (StuntDouble *)0x0) {
            siteIndex = 0;
            do {
              pp_Var7 = pp_Var7 + 1;
              prepareSiteLine_abi_cxx11_(&local_a8,local_88,sd,iVar5,siteIndex);
              std::__cxx11::string::_M_append
                        ((char *)&local_78,
                         CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
                  &local_a8.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                         (int)local_a8._M_dataplus._M_p),
                                local_a8.field_2._M_allocated_capacity + 1);
              }
              if (pp_Var7 == pSVar4[2].properties_._vptr_PropertyMap) {
                sd = (StuntDouble *)0x0;
              }
              else {
                sd = (StuntDouble *)*pp_Var7;
              }
              siteIndex = siteIndex + 1;
            } while (sd != (StuntDouble *)0x0);
          }
        }
        local_58 = local_58 + 1;
      }
      pMVar1 = SimInfo::nextMolecule(local_88->info_,&local_80);
    }
    if (local_b4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,local_78,local_70);
      local_a8._M_dataplus._M_p._0_4_ = 1;
      if (1 < local_b8) {
        do {
          MPI_Bcast(&local_a8,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
          MPI_Recv(&local_bc,1,&ompi_mpi_int,(int)local_a8._M_dataplus._M_p,0xffffffff,
                   &ompi_mpi_comm_world,local_48);
          iVar5 = local_bc;
          pcVar2 = (char *)operator_new__((long)local_bc);
          MPI_Recv(pcVar2,iVar5,&ompi_mpi_char,(int)local_a8._M_dataplus._M_p,0xffffffff,
                   &ompi_mpi_comm_world,local_48);
          sVar3 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,pcVar2,sVar3);
          operator_delete__(pcVar2);
          local_a8._M_dataplus._M_p._0_4_ = (int)local_a8._M_dataplus._M_p + 1;
        } while ((int)local_a8._M_dataplus._M_p < local_b8);
      }
    }
    else {
      local_a8._M_dataplus._M_p._0_4_ = (int)local_70 + 1;
      local_bc = 0;
      if (1 < local_b8) {
        iVar5 = 1;
        do {
          MPI_Bcast(&local_bc,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
          if (local_bc == local_b4) {
            MPI_Send(&local_a8,1,&ompi_mpi_int,0,0,&ompi_mpi_comm_world);
            MPI_Send(local_78,(int)local_a8._M_dataplus._M_p,&ompi_mpi_char,0,0,&ompi_mpi_comm_world
                    );
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < local_b8);
      }
    }
    if (local_b4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b0,"    </SiteData>\n",0x10);
    }
  }
  if (local_b4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b0,"  </Snapshot>\n",0xe);
    std::ostream::flush();
    (**(code **)(**(long **)((long)&local_b0[2].dumpFile_ +
                            (long)local_b0->info_[-1].molToProcMap_.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) + 0x30))();
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  return;
}

Assistant:

void DumpWriter::writeFrame(std::ostream& os) {
#ifdef IS_MPI
    MPI_Status istatus;
#endif

    Molecule* mol;
    StuntDouble* sd;
    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ii;
    RigidBody::AtomIterator ai;

#ifndef IS_MPI
    os << "  <Snapshot>\n";

    writeFrameProperties(os, info_->getSnapshotManager()->getCurrentSnapshot());

    os << "    <StuntDoubles>\n";
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        os << prepareDumpLine(sd);
      }
    }
    os << "    </StuntDoubles>\n";

    if (doSiteData_) {
      os << "    <SiteData>\n";
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          os << prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              os << prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }
      os << "    </SiteData>\n";
    }
    os << "  </Snapshot>\n";

    os.flush();
    os.rdbuf()->pubsync();
#else

    const int primaryNode = 0;
    int worldRank;
    int nProc;

    MPI_Comm_size(MPI_COMM_WORLD, &nProc);
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);

    if (worldRank == primaryNode) {
      os << "  <Snapshot>\n";
      writeFrameProperties(os,
                           info_->getSnapshotManager()->getCurrentSnapshot());
      os << "    <StuntDoubles>\n";
    }

    // every node prepares the dump lines for integrable objects belong to
    // itself
    std::string buffer;
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        buffer += prepareDumpLine(sd);
      }
    }

    if (worldRank == primaryNode) {
      os << buffer;

      for (int i = 1; i < nProc; ++i) {
        // tell processor i to start sending us data:

        MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

        // receive the length of the string buffer that was
        // prepared by processor i:
        int recvLength;
        MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                 &istatus);

        // create a buffer to receive the data
        char* recvBuffer = new char[recvLength];
        if (recvBuffer == NULL) {
        } else {
          // receive the data:
          MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                   MPI_COMM_WORLD, &istatus);
          // send it to the file:
          os << recvBuffer;
          // get rid of the receive buffer:
          delete[] recvBuffer;
        }
      }
    } else {
      int sendBufferLength = buffer.size() + 1;
      int myturn           = 0;
      for (int i = 1; i < nProc; ++i) {
        // wait for the primary node to call our number:
        MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
        if (myturn == worldRank) {
          // send the length of our buffer:

          MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                   MPI_COMM_WORLD);

          // send our buffer:
          MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                   primaryNode, 0, MPI_COMM_WORLD);
        }
      }
    }

    if (worldRank == primaryNode) { os << "    </StuntDoubles>\n"; }

    if (doSiteData_) {
      if (worldRank == primaryNode) { os << "    <SiteData>\n"; }
      buffer.clear();
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (sd = mol->beginIntegrableObject(ii); sd != NULL;
             sd = mol->nextIntegrableObject(ii)) {
          int ioIndex = sd->getGlobalIntegrableObjectIndex();
          // do one for the IO itself
          buffer += prepareSiteLine(sd, ioIndex, 0);

          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            int siteIndex = 0;
            for (Atom* atom = rb->beginAtom(ai); atom != NULL;
                 atom       = rb->nextAtom(ai)) {
              buffer += prepareSiteLine(atom, ioIndex, siteIndex);
              siteIndex++;
            }
          }
        }
      }

      if (worldRank == primaryNode) {
        os << buffer;

        for (int i = 1; i < nProc; ++i) {
          // tell processor i to start sending us data:
          MPI_Bcast(&i, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);

          // receive the length of the string buffer that was
          // prepared by processor i:
          int recvLength;
          MPI_Recv(&recvLength, 1, MPI_INT, i, MPI_ANY_TAG, MPI_COMM_WORLD,
                   &istatus);

          // create a buffer to receive the data
          char* recvBuffer = new char[recvLength];
          if (recvBuffer == NULL) {
          } else {
            // receive the data:
            MPI_Recv(recvBuffer, recvLength, MPI_CHAR, i, MPI_ANY_TAG,
                     MPI_COMM_WORLD, &istatus);
            // send it to the file:
            os << recvBuffer;
            // get rid of the receive buffer:
            delete[] recvBuffer;
          }
        }
      } else {
        int sendBufferLength = buffer.size() + 1;
        int myturn           = 0;
        for (int i = 1; i < nProc; ++i) {
          // wait for the primary node to call our number:
          MPI_Bcast(&myturn, 1, MPI_INT, primaryNode, MPI_COMM_WORLD);
          if (myturn == worldRank) {
            // send the length of our buffer:
            MPI_Send(&sendBufferLength, 1, MPI_INT, primaryNode, 0,
                     MPI_COMM_WORLD);
            // send our buffer:
            MPI_Send((void*)buffer.c_str(), sendBufferLength, MPI_CHAR,
                     primaryNode, 0, MPI_COMM_WORLD);
          }
        }
      }

      if (worldRank == primaryNode) { os << "    </SiteData>\n"; }
    }

    if (worldRank == primaryNode) {
      os << "  </Snapshot>\n";
      os.flush();
      os.rdbuf()->pubsync();
    }

#endif  // is_mpi
  }